

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

pair<tinyusdz::Path,_tinyusdz::Path> * __thiscall
tinyusdz::Path::split_at_root
          (pair<tinyusdz::Path,_tinyusdz::Path> *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  ulong uVar2;
  Path local_7f0;
  Path local_720;
  allocator local_649;
  string local_648;
  undefined1 local_628 [8];
  Path sP;
  string local_550;
  undefined1 local_530 [8];
  Path rP;
  string siblings;
  string root;
  size_t n;
  char *local_348;
  char *local_340;
  difference_type local_338;
  difference_type ndist;
  undefined8 local_320;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  char *local_310;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  Path local_2f8;
  undefined1 local_228 [8];
  string p;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  Path local_e8;
  Path *local_18;
  Path *this_local;
  
  local_18 = this;
  this_local = &__return_storage_ptr__->first;
  bVar1 = is_absolute_path(this);
  if (bVar1) {
    bVar1 = is_root_path(this);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_108,"/",&local_109);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_130,"",&local_131);
      Path(&local_e8,&local_108,&local_130);
      Path((Path *)((long)&p.field_2 + 8));
      ::std::make_pair<tinyusdz::Path,tinyusdz::Path>
                (__return_storage_ptr__,&local_e8,(Path *)((long)&p.field_2 + 8));
      ~Path((Path *)((long)&p.field_2 + 8));
      ~Path(&local_e8);
      ::std::__cxx11::string::~string((string *)&local_130);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    else {
      full_path_name_abi_cxx11_((string *)local_228,this);
      uVar2 = ::std::__cxx11::string::size();
      if (uVar2 < 2) {
        Path(&local_2f8);
        ::std::make_pair<tinyusdz::Path_const&,tinyusdz::Path>
                  (__return_storage_ptr__,this,&local_2f8);
        ~Path(&local_2f8);
        ret._M_current._4_4_ = 1;
      }
      else {
        local_318._M_current = (char *)::std::__cxx11::string::begin();
        local_310 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator+(&local_318,1);
        local_320 = ::std::__cxx11::string::end();
        local_308 = ::std::
                    find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,tinyusdz::Path::split_at_root()const::__0>
                              (local_310,local_320);
        ndist = ::std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=
                          (&local_308,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&ndist);
        if (bVar1) {
          local_340 = (char *)::std::__cxx11::string::begin();
          local_348 = local_308._M_current;
          local_338 = ::std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_340,local_308);
          if (local_338 < 1) {
            Path((Path *)&n);
            ::std::make_pair<tinyusdz::Path_const&,tinyusdz::Path>
                      (__return_storage_ptr__,this,(Path *)&n);
            ~Path((Path *)&n);
            ret._M_current._4_4_ = 1;
          }
          else {
            ::std::__cxx11::string::substr((ulong)((long)&siblings.field_2 + 8),(ulong)local_228);
            ::std::__cxx11::string::substr((ulong)&rP._valid,(ulong)local_228);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_550,"",(allocator *)&sP.field_0xcf);
            Path((Path *)local_530,(string *)((long)&siblings.field_2 + 8),&local_550);
            ::std::__cxx11::string::~string((string *)&local_550);
            ::std::allocator<char>::~allocator((allocator<char> *)&sP.field_0xcf);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_648,"",&local_649);
            Path((Path *)local_628,(string *)&rP._valid,&local_648);
            ::std::__cxx11::string::~string((string *)&local_648);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_649);
            ::std::make_pair<tinyusdz::Path&,tinyusdz::Path&>
                      (__return_storage_ptr__,(Path *)local_530,(Path *)local_628);
            ret._M_current._4_4_ = 1;
            ~Path((Path *)local_628);
            ~Path((Path *)local_530);
            ::std::__cxx11::string::~string((string *)&rP._valid);
            ::std::__cxx11::string::~string((string *)(siblings.field_2._M_local_buf + 8));
          }
        }
        else {
          Path(&local_720);
          ::std::make_pair<tinyusdz::Path_const&,tinyusdz::Path>
                    (__return_storage_ptr__,this,&local_720);
          ~Path(&local_720);
          ret._M_current._4_4_ = 1;
        }
      }
      ::std::__cxx11::string::~string((string *)local_228);
    }
  }
  else {
    Path(&local_7f0);
    ::std::make_pair<tinyusdz::Path,tinyusdz::Path_const&>(__return_storage_ptr__,&local_7f0,this);
    ~Path(&local_7f0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<Path, Path> Path::split_at_root() const {
  if (is_absolute_path()) {
    if (is_root_path()) {
      return std::make_pair(Path("/", ""), Path());
    }

    std::string p = full_path_name();

    if (p.size() < 2) {
      // Never should reach here. just in case
      return std::make_pair(*this, Path());
    }

    // Fine 2nd '/'
    auto ret =
        std::find_if(p.begin() + 1, p.end(), [](char c) { return c == '/'; });

    if (ret != p.end()) {
      auto ndist = std::distance(p.begin(), ret);  // distance from str[0]
      if (ndist < 1) {
        // This should not happen though.
        return std::make_pair(*this, Path());
      }
      size_t n = size_t(ndist);
      std::string root = p.substr(0, n);
      std::string siblings = p.substr(n);

      Path rP(root, "");
      Path sP(siblings, "");

      return std::make_pair(rP, sP);
    }

    return std::make_pair(*this, Path());
  } else {
    return std::make_pair(Path(), *this);
  }
}